

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

MP<136UL,_GF2::MOGrevlex<136UL>_> * __thiscall
GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>::SPoly
          (MP<136UL,_GF2::MOGrevlex<136UL>_> *this,MP<136UL,_GF2::MOGrevlex<136UL>_> *poly1,
          MP<136UL,_GF2::MOGrevlex<136UL>_> *poly2)

{
  bool bVar1;
  MM<136UL> *pMVar2;
  MM<136UL> *m2;
  MM<136UL> *mRight;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *this_00;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_RDI;
  const_iterator iter;
  MM<136UL> m;
  MM<136UL> lm;
  MM<136UL> *in_stack_ffffffffffffff58;
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_stack_ffffffffffffff60;
  MM<136UL> *in_stack_ffffffffffffff68;
  MM<136UL> *in_stack_ffffffffffffff70;
  _Self local_70;
  _List_node_base *local_68;
  _Self local_60;
  _List_node_base *local_58;
  _List_const_iterator<GF2::MM<136UL>_> local_50 [2];
  MP<136UL,_GF2::MOGrevlex<136UL>_> *in_stack_ffffffffffffffc0;
  
  MM<136UL>::MM((MM<136UL> *)0x1839f6);
  MM<136UL>::MM((MM<136UL> *)0x183a00);
  std::_List_const_iterator<GF2::MM<136UL>_>::_List_const_iterator(local_50);
  SetEmpty((MP<136UL,_GF2::MOGrevlex<136UL>_> *)0x183a14);
  LM(in_stack_ffffffffffffff60);
  pMVar2 = LM(in_stack_ffffffffffffff60);
  LM(in_stack_ffffffffffffff60);
  MM<136UL>::LCM(pMVar2,(MM<136UL> *)in_RDI,in_stack_ffffffffffffff70);
  MM<136UL>::operator/=(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  local_58 = (_List_node_base *)
             std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::begin
                       ((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)
                        in_stack_ffffffffffffff58);
  local_50[0]._M_node = local_58;
  while( true ) {
    m2 = (MM<136UL> *)std::_List_const_iterator<GF2::MM<136UL>_>::operator++(local_50);
    local_60._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::end
                   ((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)
                    in_stack_ffffffffffffff58);
    bVar1 = std::operator!=((_Self *)m2,&local_60);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MM<136UL>_>::operator*
              ((_List_const_iterator<GF2::MM<136UL>_> *)0x183ac0);
    MM<136UL>::operator=((MM<136UL> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    MM<136ul>::operator*=((MM<136UL> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::push_back
              ((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)m2,
               in_stack_ffffffffffffff68);
  }
  mRight = LM(in_stack_ffffffffffffff60);
  this_00 = (MP<136UL,_GF2::MOGrevlex<136UL>_> *)LM(in_stack_ffffffffffffff60);
  LM(this_00);
  MM<136UL>::LCM(pMVar2,(MM<136UL> *)in_RDI,m2);
  MM<136UL>::operator/=(m2,mRight);
  local_68 = (_List_node_base *)
             std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::begin
                       ((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)
                        in_stack_ffffffffffffff58);
  local_50[0]._M_node = local_68;
  while( true ) {
    pMVar2 = (MM<136UL> *)std::_List_const_iterator<GF2::MM<136UL>_>::operator++(local_50);
    local_70._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::end
                   ((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)pMVar2);
    bVar1 = std::operator!=((_Self *)pMVar2,&local_70);
    if (!bVar1) break;
    std::_List_const_iterator<GF2::MM<136UL>_>::operator*
              ((_List_const_iterator<GF2::MM<136UL>_> *)0x183b93);
    MM<136UL>::operator=((MM<136UL> *)this_00,pMVar2);
    MM<136ul>::operator*=((MM<136UL> *)this_00,pMVar2);
    std::__cxx11::list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_>::push_back
              ((list<GF2::MM<136UL>,_std::allocator<GF2::MM<136UL>_>_> *)m2,mRight);
  }
  Normalize(in_stack_ffffffffffffffc0);
  return in_RDI;
}

Assistant:

MP& SPoly(const MP& poly1, const MP& poly2)
	{
		// предусловия
		assert(IsConsistent(poly1) && IsConsistent(poly2));
		assert(this != &poly1 && this != &poly2);
		// сбор мономов
		MM<_n> lm, m;
		const_iterator iter;
		SetEmpty();
		lm.LCM(poly1.LM(), poly2.LM()) /= poly1.LM();
		for (iter = poly1.begin(); ++iter != poly1.end();)
			push_back((m = *iter) *= lm);
		lm.LCM(poly1.LM(), poly2.LM()) /= poly2.LM();
		for (iter = poly2.begin(); ++iter != poly2.end();)
			push_back((m = *iter) *= lm);
		// нормализация
		Normalize();
		return *this;
	}